

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O1

positionTy * __thiscall positionTy::LocalToWorld(positionTy *this)

{
  undefined1 *puVar1;
  
  if (((this->f).field_0x1 & 4) != 0) {
    XPLMLocalToWorld(this->_lon,this->_alt,this->_lat,this,&this->_lon,&this->_alt);
    puVar1 = &(this->f).field_0x1;
    *puVar1 = *puVar1 & 0xfb;
  }
  return this;
}

Assistant:

positionTy& positionTy::LocalToWorld()
{
    if (f.unitCoord == UNIT_LOCAL) {
        XPLMLocalToWorld(X(), Y(), Z(),
                         &lat(), &lon(), &alt_m());
        f.unitCoord = UNIT_WORLD;
    }
    return *this;
}